

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall
xmrig::WorkerJob<3UL>::save(WorkerJob<3UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t __n;
  char *pcVar3;
  uint8_t *__s;
  uint32_t *puVar4;
  uint in_ECX;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  WorkerJob<3UL> *in_RSI;
  WorkerJob<3UL> *pWVar6;
  WorkerJob<3UL> *__s_00;
  WorkerJob<3UL> *in_RDI;
  size_t i;
  size_t size;
  Job *in_stack_ffffffffffffffa8;
  uint8_t *__dest;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Job *i_00;
  char *local_28;
  
  pWVar6 = in_RSI;
  pcVar2 = Job::index((Job *)in_RSI,(char *)in_RSI,in_EDX);
  in_RDI->m_index = (uint8_t)pcVar2;
  __n = Job::size((Job *)in_RSI);
  i_00 = in_RDI->m_jobs;
  __s_00 = in_RSI;
  index(in_RDI,(char *)pWVar6,__c);
  pWVar6 = __s_00;
  Job::operator=((Job *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
  pcVar2 = index(in_RDI,(char *)__s_00,__c_00);
  in_RDI->m_rounds[(ulong)pcVar2 & 0xff] = 0;
  pcVar3 = index(in_RDI,(char *)__s_00,__c_01);
  pcVar2 = (char *)(ulong)in_ECX;
  Job::setBackend(in_RDI->m_jobs + ((ulong)pcVar3 & 0xff),in_ECX);
  uVar5 = extraout_RDX;
  for (local_28 = (char *)0x0; local_28 < (char *)0x3; local_28 = local_28 + 1) {
    pcVar2 = index(in_RDI,pcVar2,(int)uVar5);
    __dest = in_RDI->m_blobs[(ulong)pcVar2 & 0xff] + (long)local_28 * __n;
    __s = Job::blob((Job *)in_RSI);
    memcpy(__dest,__s,__n);
    index(in_RDI,(char *)__s,__c_02);
    nonce(pWVar6,(size_t)i_00);
    uVar1 = Nonce::next((uint8_t)((ulong)pWVar6 >> 0x38),(uint32_t)pWVar6,
                        (uint32_t)((ulong)i_00 >> 0x20));
    pcVar2 = local_28;
    puVar4 = nonce(pWVar6,(size_t)i_00);
    *puVar4 = uVar1;
    uVar5 = extraout_RDX_00;
  }
  return;
}

Assistant:

inline void save(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
    {
        m_index           = job.index();
        const size_t size = job.size();
        m_jobs[index()]   = job;
        m_rounds[index()] = 0;

        m_jobs[index()].setBackend(backend);

        for (size_t i = 0; i < N; ++i) {
            memcpy(m_blobs[index()] + (i * size), job.blob(), size);
            *nonce(i) = Nonce::next(index(), *nonce(i), reserveCount);
        }
    }